

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

void fire_damageu(int n,monst *mtmp,char *k_name,int k_format,int destroy,boolean fire,
                 boolean hurt_maxhp)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  int local_40;
  int local_3c;
  int local_30;
  int alt;
  boolean fire_local;
  int destroy_local;
  int k_format_local;
  char *k_name_local;
  monst *mtmp_local;
  int n_local;
  
  if (u.uprops[0x37].intrinsic == 0) {
    mtmp_local._4_4_ = n;
    if ((fire != '\0') && (u.umonnum != u.umonster)) {
      puVar2 = &switchD_00229f4a::switchdataD_00371868;
      pcVar3 = k_name;
      switch(u.umonnum + -0xff) {
      case 0:
        puVar2 = (uint *)0x2;
        local_30 = u.mhmax / 2;
        pcVar3 = (char *)((long)u.mhmax % 2 & 0xffffffff);
        break;
      case 1:
        local_30 = u.mhmax;
        break;
      default:
        local_30 = 0;
        break;
      case 5:
        puVar2 = (uint *)0x8;
        local_30 = u.mhmax / 8;
        pcVar3 = (char *)((long)u.mhmax % 8 & 0xffffffff);
        break;
      case 6:
        puVar2 = (uint *)0x4;
        local_30 = u.mhmax / 4;
        pcVar3 = (char *)((long)u.mhmax % 4 & 0xffffffff);
      }
      if ((local_30 != 0) &&
         (pline("You roast!",mtmp,pcVar3,puVar2,destroy,hurt_maxhp), n < local_30)) {
        mtmp_local._4_4_ = local_30;
      }
    }
    if (((u.uprops[1].intrinsic == 0) && (u.uprops[1].extrinsic == 0)) &&
       ((youmonst.mintrinsics & 1) == 0)) {
      if (hurt_maxhp != '\0') {
        if (u.umonnum == u.umonster) {
          if (u.ulevel < u.uhpmax) {
            if (u.uhpmax < mtmp_local._4_4_ + 1) {
              local_40 = u.uhpmax;
            }
            else {
              local_40 = mtmp_local._4_4_ + 1;
            }
            iVar1 = rn2(local_40);
            u.uhpmax = u.uhpmax - iVar1;
            if (u.uhpmax < u.uhp) {
              u.uhp = u.uhpmax;
            }
            iflags.botl = '\x01';
          }
        }
        else if (mons[u.umonnum].mlevel < u.mhmax) {
          if (u.mhmax < mtmp_local._4_4_ + 1) {
            local_3c = u.mhmax;
          }
          else {
            local_3c = mtmp_local._4_4_ + 1;
          }
          iVar1 = rn2(local_3c);
          u.mhmax = u.mhmax - iVar1;
          if (u.mhmax < u.mh) {
            u.mh = u.mhmax;
          }
          iflags.botl = '\x01';
        }
      }
    }
    else {
      shieldeff(u.ux,u.uy);
      if ((((u.uprops[1].intrinsic == 0) && (u.uprops[1].extrinsic == 0)) &&
          ((youmonst.mintrinsics & 1) == 0)) ||
         ((((u.uprops[1].intrinsic & 0x4000000) != 0 && ((u.uprops[1].intrinsic & 0xfbffffff) == 0))
          && ((u.uprops[1].extrinsic == 0 && ((youmonst.mintrinsics & 1) == 0)))))) {
        if (((((u.uprops[1].intrinsic & 0x4000000) != 0) &&
             ((u.uprops[1].intrinsic & 0xfbffffff) == 0)) && (u.uprops[1].extrinsic == 0)) &&
           ((youmonst.mintrinsics & 1) == 0)) {
          mtmp_local._4_4_ = (mtmp_local._4_4_ + 1) / 2;
        }
      }
      else {
        if (fire == '\0') {
          pline("You feel mildly hot.");
        }
        else {
          pline("The fire doesn\'t feel hot!");
        }
        ugolemeffects(2,mtmp_local._4_4_);
        mtmp_local._4_4_ = 0;
      }
    }
  }
  else {
    pline("You are unharmed!");
    mtmp_local._4_4_ = 0;
  }
  burn_away_slime();
  iVar1 = rn2(0x14);
  if (iVar1 < destroy) {
    destroy_item(9,2);
  }
  iVar1 = rn2(0x14);
  if (iVar1 < destroy) {
    destroy_item(8,2);
  }
  iVar1 = rn2(0x19);
  if (iVar1 < destroy) {
    destroy_item(10,2);
  }
  iVar1 = rn2(0x14);
  if (iVar1 < destroy) {
    burnarmor(&youmonst);
  }
  if (mtmp_local._4_4_ != 0) {
    if (mtmp == (monst *)0x0) {
      losehp(mtmp_local._4_4_,k_name,k_format);
    }
    else {
      mdamageu(mtmp,mtmp_local._4_4_);
    }
  }
  return;
}

Assistant:

void fire_damageu(int n, struct monst *mtmp, const char *k_name, int k_format,
		  int destroy, boolean fire, boolean hurt_maxhp)
{
	if (Invulnerable) {
	    pline("You are unharmed!");
	    n = 0;
	} else {
	    /* certain golems take a lot of damage from the heat */
	    if (fire && Upolyd) {
		int alt;
		switch (u.umonnum) {
		case PM_PAPER_GOLEM:	alt = u.mhmax; break;
		case PM_STRAW_GOLEM:	alt = u.mhmax / 2; break;
		case PM_WOOD_GOLEM:	alt = u.mhmax / 4; break;
		case PM_LEATHER_GOLEM:	alt = u.mhmax / 8; break;
		default:		alt = 0; break;
		}
		if (alt) {
		    pline("You roast!");
		    if (alt > n) n = alt;
		}
	    }

	    if (Fire_resistance) {
		shieldeff(u.ux, u.uy);
		if (FFire_resistance) {
		    if (fire)
			pline("The fire doesn't feel hot!");
		    else
			pline("You feel mildly hot.");
		    ugolemeffects(AD_FIRE, n);
		    n = 0;
		} else if (PFire_resistance) {
		    n = (n + 1) / 2;
		}
	    } else if (hurt_maxhp) {
		if (Upolyd) {
		    if (u.mhmax > mons[u.umonnum].mlevel) {
			u.mhmax -= rn2(min(u.mhmax, n + 1));
			if (u.mh > u.mhmax) u.mh = u.mhmax;
			iflags.botl = 1;
		    }
		} else if (u.uhpmax > u.ulevel) {
		    u.uhpmax -= rn2(min(u.uhpmax, n + 1));
		    if (u.uhp > u.uhpmax) u.uhp = u.uhpmax;
		    iflags.botl = 1;
		}
	    }
	}

	burn_away_slime();
	if (destroy > rn2(20)) destroy_item(SCROLL_CLASS, AD_FIRE);
	if (destroy > rn2(20)) destroy_item(POTION_CLASS, AD_FIRE);
	if (destroy > rn2(25)) destroy_item(SPBOOK_CLASS, AD_FIRE);
	if (destroy > rn2(20)) burnarmor(&youmonst);

	if (n) {
	    if (mtmp)
		mdamageu(mtmp, n);
	    else
		losehp(n, k_name, k_format);
	}
}